

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsepos.cpp
# Opt level: O0

int __thiscall
icu_63::ParsePosition::clone
          (ParsePosition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParsePosition *this_00;
  undefined8 local_30;
  ParsePosition *this_local;
  
  this_00 = (ParsePosition *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  local_30 = (ParsePosition *)0x0;
  if (this_00 != (ParsePosition *)0x0) {
    ParsePosition(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

ParsePosition *
ParsePosition::clone() const {
    return new ParsePosition(*this);
}